

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaK_jump(FuncState *fs)

{
  int l2;
  int j;
  
  l2 = fs->jpc;
  fs->jpc = -1;
  j = luaK_codeABx(fs,OP_JMP,0,0x1fffe);
  luaK_concat(fs,&j,l2);
  return j;
}

Assistant:

static int luaK_jump(FuncState*fs){
int jpc=fs->jpc;
int j;
fs->jpc=(-1);
j=luaK_codeAsBx(fs,OP_JMP,0,(-1));
luaK_concat(fs,&j,jpc);
return j;
}